

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O1

void writecolourmap(nn_quant *nnq,FILE *f)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  
  piVar4 = nnq->network[0] + 3;
  lVar2 = 3;
  do {
    if (0 < nnq->netsize) {
      lVar1 = 0;
      piVar3 = piVar4;
      do {
        putc(*piVar3,(FILE *)f);
        lVar1 = lVar1 + 1;
        piVar3 = piVar3 + 5;
      } while (lVar1 < nnq->netsize);
    }
    piVar4 = piVar4 + -1;
    bVar5 = lVar2 != 0;
    lVar2 = lVar2 + -1;
  } while (bVar5);
  return;
}

Assistant:

void writecolourmap(nnq, f)
nn_quant *nnq;
FILE *f;
{
	int i,j;

	for (i=3; i>=0; i--)
		for (j=0; j < nnq->netsize; j++)
			putc(nnq->network[j][i], f);
}